

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void google::protobuf::internal::(anonymous_namespace)::
     TestInline<google::protobuf::internal::MicroStringExtraImpl<16ul>>(void)

{
  Arena *arena_00;
  bool bVar1;
  const_iterator ppAVar2;
  char *pcVar3;
  string_view sVar4;
  AssertHelper local_1d0;
  Message local_1c8;
  size_t local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_2;
  Message local_198;
  uint64_t local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  Message local_170;
  string_view local_168;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  uint64_t local_138;
  size_t used;
  undefined1 local_120 [8];
  MicroStringExtraImpl<16UL> str;
  string_view input;
  size_t size;
  Arena *a;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<google::protobuf::Arena_*> **local_d0;
  initializer_list<google::protobuf::Arena_*> local_c8;
  initializer_list<google::protobuf::Arena_*> *local_b8;
  initializer_list<google::protobuf::Arena_*> *__range3;
  Arena arena;
  
  Arena::Arena((Arena *)&__range3);
  __begin3 = (const_iterator)0x0;
  local_d0 = &__range3;
  local_c8._M_array = (iterator)&__begin3;
  local_c8._M_len = 2;
  local_b8 = &local_c8;
  __end3 = std::initializer_list<google::protobuf::Arena_*>::begin(local_b8);
  ppAVar2 = std::initializer_list<google::protobuf::Arena_*>::end(local_b8);
  for (; __end3 != ppAVar2; __end3 = __end3 + 1) {
    arena_00 = *__end3;
    for (input._M_str = (char *)0x0; input._M_str < (char *)0x18; input._M_str = input._M_str + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(str.extra_buffer_ + 8),
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZ",(size_type)input._M_str);
      MicroStringExtraImpl<16UL>::MicroStringExtraImpl((MicroStringExtraImpl<16UL> *)local_120);
      local_138 = Arena::SpaceUsed((Arena *)&__range3);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )str.extra_buffer_._8_8_;
      sVar4._M_str = (char *)input._M_len;
      sVar4._M_len._0_1_ = str.extra_buffer_[8];
      sVar4._M_len._1_1_ = str.extra_buffer_[9];
      sVar4._M_len._2_1_ = str.extra_buffer_[10];
      sVar4._M_len._3_1_ = str.extra_buffer_[0xb];
      sVar4._M_len._4_1_ = str.extra_buffer_[0xc];
      sVar4._M_len._5_1_ = str.extra_buffer_[0xd];
      sVar4._M_len._6_1_ = str.extra_buffer_[0xe];
      sVar4._M_len._7_1_ = str.extra_buffer_[0xf];
      MicroStringExtraImpl<16UL>::Set((MicroStringExtraImpl<16UL> *)local_120,sVar4,arena_00);
      sVar4 = MicroString::Get((MicroString *)local_120);
      local_168 = sVar4;
      testing::internal::EqHelper::
      Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                ((EqHelper *)local_158,"str.Get()","input",&local_168,
                 (basic_string_view<char,_std::char_traits<char>_> *)(str.extra_buffer_ + 8));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0xd7,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_170);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_170);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
      local_190 = Arena::SpaceUsed((Arena *)&__range3);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_188,"used","arena.SpaceUsed()",&local_138,&local_190);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(&local_198);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0xd8,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_198);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      local_1b4 = 0;
      local_1c0 = MicroString::SpaceUsedExcludingSelfLong((MicroString *)local_120);
      testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                ((EqHelper *)local_1b0,"0","str.SpaceUsedExcludingSelfLong()",&local_1b4,&local_1c0)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0xd9,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        testing::Message::~Message(&local_1c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    }
  }
  Arena::~Arena((Arena *)&__range3);
  return;
}

Assistant:

void TestInline() {
  Arena arena;
  for (Arena* a : {static_cast<Arena*>(nullptr), &arena}) {
    for (size_t size = 0; size <= T::kInlineCapacity; ++size) {
      const absl::string_view input("ABCDEFGHIJKLMNOPQRSTUVWXYZ", size);
      T str;
      size_t used = arena.SpaceUsed();
      str.Set(input, a);
      EXPECT_EQ(str.Get(), input);
      EXPECT_EQ(used, arena.SpaceUsed());
      EXPECT_EQ(0, str.SpaceUsedExcludingSelfLong());

      // We explicitly don't call Destroy() here. If we allocated heap by
      // mistake it will be detected as a memory leak.
    }
  }
}